

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

vector<long,_std::allocator<long>_> *
clickhouse::SliceVector<long>(vector<long,_std::allocator<long>_> *vec,size_t begin,size_t len)

{
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *p_Var1;
  size_type sVar2;
  unsigned_long *puVar3;
  const_iterator __first;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *in_RDX;
  vector<long,_std::allocator<long>_> *in_RSI;
  vector<long,_std::allocator<long>_> *in_RDI;
  vector<long,_std::allocator<long>_> *result;
  vector<long,_std::allocator<long>_> *__n;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *this;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
  in_stack_ffffffffffffffa8;
  unsigned_long local_30;
  undefined1 local_21;
  unsigned_long local_20;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *local_18;
  vector<long,_std::allocator<long>_> *local_10;
  
  local_21 = 0;
  __n = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x21555e);
  this = local_18;
  p_Var1 = (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *)
           std::vector<long,_std::allocator<long>_>::size(local_10);
  if (this < p_Var1) {
    sVar2 = std::vector<long,_std::allocator<long>_>::size(local_10);
    local_30 = sVar2 - (long)local_18;
    puVar3 = std::min<unsigned_long>(&local_20,&local_30);
    local_20 = *puVar3;
    std::vector<long,_std::allocator<long>_>::begin(in_RDI);
    __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::operator+
              (this,(difference_type)__n);
    __first = std::vector<long,_std::allocator<long>_>::begin(in_RDI);
    __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::operator+
              (this,(difference_type)__n);
    std::vector<long,std::allocator<long>>::
    assign<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,void>
              (in_stack_ffffffffffffffa0,
               (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
               __first._M_current,in_stack_ffffffffffffffa8);
  }
  return __n;
}

Assistant:

std::vector<T> SliceVector(const std::vector<T>& vec, size_t begin, size_t len) {
    std::vector<T> result;

    if (begin < vec.size()) {
        len = std::min(len, vec.size() - begin);
        result.assign(vec.begin() + begin, vec.begin() + (begin + len));
    }

    return result;
}